

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

uint32_t FACT_INTERNAL_ParseAudioEngine(FACTAudioEngine *pEngine,FACTRuntimeParameters *pParams)

{
  uint8_t *puVar1;
  code *pcVar2;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  uint32_t uVar7;
  undefined8 uVar8;
  long in_RSI;
  long in_RDI;
  float fVar9;
  SDL_AssertState sdl_assert_state_11;
  SDL_AssertState sdl_assert_state_10;
  SDL_AssertState sdl_assert_state_9;
  SDL_AssertState sdl_assert_state_8;
  SDL_AssertState sdl_assert_state_7;
  SDL_AssertState sdl_assert_state_6;
  SDL_AssertState sdl_assert_state_5;
  SDL_AssertState sdl_assert_state_4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint8_t *start;
  uint8_t *ptr;
  uint16_t j;
  uint16_t i;
  size_t memsize;
  uint32_t magic;
  uint8_t se;
  uint8_t tool;
  uint8_t version;
  uint16_t blob2Count;
  uint16_t blob1Count;
  uint32_t dspParameterOffset;
  uint32_t dspPresetOffset;
  uint32_t rpcOffset;
  uint32_t variableNameOffset;
  uint32_t categoryNameOffset;
  uint32_t variableNameIndexOffset;
  uint32_t blob2Offset;
  uint32_t categoryNameIndexOffset;
  uint32_t blob1Offset;
  uint32_t variableOffset;
  uint32_t categoryOffset;
  uint8_t *local_68;
  ushort local_5c;
  ushort local_5a;
  long local_58;
  uint32_t local_50;
  uint8_t local_4b;
  char local_4a;
  uint8_t local_49;
  uint16_t local_48;
  uint16_t local_46;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t local_1c;
  long local_18;
  long local_10;
  uint32_t local_4;
  
  puVar1 = *(uint8_t **)(in_RSI + 8);
  local_68 = puVar1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_50 = read_u32(&local_68,'\0');
  local_4b = local_50 == 0x58475346;
  if ((local_50 == 0x46534758) || (local_50 == 0x58475346)) {
    uVar5 = read_u16(&local_68,local_4b);
    iVar6 = FACT_INTERNAL_SupportedContent(uVar5);
    if (iVar6 == 0) {
      local_4 = 0xfffffffe;
    }
    else {
      uVar5 = read_u16(&local_68,local_4b);
      local_4a = (char)uVar5;
      if (local_4a == '*') {
        local_68 = local_68 + 10;
        local_49 = read_u8(&local_68);
        if ((local_49 == '\x03') || (local_49 == '\a')) {
          uVar5 = read_u16(&local_68,local_4b);
          *(uint16_t *)(local_10 + 0x20) = uVar5;
          uVar5 = read_u16(&local_68,local_4b);
          *(uint16_t *)(local_10 + 0x22) = uVar5;
          local_46 = read_u16(&local_68,local_4b);
          local_48 = read_u16(&local_68,local_4b);
          uVar5 = read_u16(&local_68,local_4b);
          *(uint16_t *)(local_10 + 0x24) = uVar5;
          uVar5 = read_u16(&local_68,local_4b);
          *(uint16_t *)(local_10 + 0x26) = uVar5;
          uVar5 = read_u16(&local_68,local_4b);
          *(uint16_t *)(local_10 + 0x28) = uVar5;
          local_1c = read_u32(&local_68,local_4b);
          local_20 = read_u32(&local_68,local_4b);
          local_24 = read_u32(&local_68,local_4b);
          local_28 = read_u32(&local_68,local_4b);
          local_2c = read_u32(&local_68,local_4b);
          local_30 = read_u32(&local_68,local_4b);
          local_34 = read_u32(&local_68,local_4b);
          local_38 = read_u32(&local_68,local_4b);
          local_3c = read_u32(&local_68,local_4b);
          local_40 = read_u32(&local_68,local_4b);
          local_44 = read_u32(&local_68,local_4b);
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_1c) goto LAB_0011c668;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x853);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011c668:
          uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x20) * 0x18);
          *(undefined8 *)(local_10 + 0x50) = uVar8;
          for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x20); local_5a = local_5a + 1) {
            uVar3 = read_u8(&local_68);
            *(uint8_t *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18) = uVar3;
            uVar5 = read_u16(&local_68,local_4b);
            *(uint16_t *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 2) = uVar5;
            uVar5 = read_u16(&local_68,local_4b);
            *(uint16_t *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 4) = uVar5;
            bVar4 = read_u8(&local_68);
            *(char *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 6) =
                 (char)((int)(uint)bVar4 >> 3);
            uVar5 = read_u16(&local_68,local_4b);
            *(uint16_t *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 8) = uVar5;
            read_volbyte((uint8_t **)0x11c7a1);
            fVar9 = FACT_INTERNAL_CalculateAmplitudeRatio(0.0);
            *(float *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 0xc) = fVar9;
            uVar3 = read_u8(&local_68);
            *(uint8_t *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 0x10) = uVar3;
            *(undefined1 *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 0x11) = 0;
            *(undefined4 *)(*(long *)(local_10 + 0x50) + (ulong)local_5a * 0x18 + 0x14) = 0x3f800000
            ;
          }
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_20) goto LAB_0011c89b;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_1,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x867);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011c89b:
          uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x22) << 4);
          *(undefined8 *)(local_10 + 0x58) = uVar8;
          for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x22); local_5a = local_5a + 1) {
            uVar3 = read_u8(&local_68);
            *(uint8_t *)(*(long *)(local_10 + 0x58) + (ulong)local_5a * 0x10) = uVar3;
            fVar9 = read_f32(&local_68,local_4b);
            *(float *)(*(long *)(local_10 + 0x58) + (ulong)local_5a * 0x10 + 4) = fVar9;
            fVar9 = read_f32(&local_68,local_4b);
            *(float *)(*(long *)(local_10 + 0x58) + (ulong)local_5a * 0x10 + 8) = fVar9;
            fVar9 = read_f32(&local_68,local_4b);
            *(float *)(*(long *)(local_10 + 0x58) + (ulong)local_5a * 0x10 + 0xc) = fVar9;
          }
          uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x22) << 2);
          *(undefined8 *)(local_10 + 0x90) = uVar8;
          for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x22); local_5a = local_5a + 1) {
            *(undefined4 *)(*(long *)(local_10 + 0x90) + (ulong)local_5a * 4) =
                 *(undefined4 *)(*(long *)(local_10 + 0x58) + (ulong)local_5a * 0x10 + 4);
          }
          if (*(short *)(local_10 + 0x24) != 0) {
            do {
              if ((long)local_68 - (long)puVar1 == (ulong)local_3c) goto LAB_0011cab1;
              iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_2,
                                          "FACT_INTERNAL_ParseAudioEngine",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                          ,0x87f);
            } while (iVar6 == 0);
            if (iVar6 == 1) {
              pcVar2 = (code *)swi(3);
              uVar7 = (*pcVar2)();
              return uVar7;
            }
LAB_0011cab1:
            uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x24) << 4);
            *(undefined8 *)(local_10 + 0x60) = uVar8;
            uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x24) << 2);
            *(undefined8 *)(local_10 + 0x40) = uVar8;
            for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x24); local_5a = local_5a + 1) {
              *(int *)(*(long *)(local_10 + 0x40) + (ulong)local_5a * 4) =
                   (int)local_68 - (int)puVar1;
              uVar5 = read_u16(&local_68,local_4b);
              *(uint16_t *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10) = uVar5;
              uVar3 = read_u8(&local_68);
              *(uint8_t *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 2) = uVar3;
              uVar5 = read_u16(&local_68,local_4b);
              *(uint16_t *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 4) = uVar5;
              uVar8 = (**(code **)(local_10 + 200))
                                ((ulong)*(byte *)(*(long *)(local_10 + 0x60) +
                                                  (ulong)local_5a * 0x10 + 2) * 0xc);
              *(undefined8 *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 8) = uVar8;
              for (local_5c = 0;
                  local_5c < *(byte *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 2);
                  local_5c = local_5c + 1) {
                fVar9 = read_f32(&local_68,local_4b);
                *(float *)(*(long *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 8) +
                          (ulong)local_5c * 0xc) = fVar9;
                fVar9 = read_f32(&local_68,local_4b);
                *(float *)(*(long *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 8) +
                           (ulong)local_5c * 0xc + 4) = fVar9;
                uVar3 = read_u8(&local_68);
                *(uint8_t *)
                 (*(long *)(*(long *)(local_10 + 0x60) + (ulong)local_5a * 0x10 + 8) +
                  (ulong)local_5c * 0xc + 8) = uVar3;
              }
            }
          }
          if (*(short *)(local_10 + 0x26) != 0) {
            do {
              if ((long)local_68 - (long)puVar1 == (ulong)local_40) goto LAB_0011cda2;
              iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_3,
                                          "FACT_INTERNAL_ParseAudioEngine",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                          ,0x89e);
            } while (iVar6 == 0);
            if (iVar6 == 1) {
              pcVar2 = (code *)swi(3);
              uVar7 = (*pcVar2)();
              return uVar7;
            }
LAB_0011cda2:
            uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x26) << 4);
            *(undefined8 *)(local_10 + 0x68) = uVar8;
            uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x26) << 2);
            *(undefined8 *)(local_10 + 0x48) = uVar8;
            for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x26); local_5a = local_5a + 1) {
              *(int *)(*(long *)(local_10 + 0x48) + (ulong)local_5a * 4) =
                   (int)local_68 - (int)puVar1;
              uVar3 = read_u8(&local_68);
              *(uint8_t *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10) = uVar3;
              uVar5 = read_u16(&local_68,local_4b);
              *(uint16_t *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 2) = uVar5;
              local_68 = local_68 + 2;
              uVar8 = (**(code **)(local_10 + 200))
                                ((ulong)*(ushort *)
                                         (*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 2) *
                                 0x14);
              *(undefined8 *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) = uVar8;
            }
            do {
              if ((long)local_68 - (long)puVar1 == (ulong)local_44) goto LAB_0011cf6a;
              iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_4,
                                          "FACT_INTERNAL_ParseAudioEngine",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                          ,0x8b4);
            } while (iVar6 == 0);
            if (iVar6 == 1) {
              pcVar2 = (code *)swi(3);
              uVar7 = (*pcVar2)();
              return uVar7;
            }
LAB_0011cf6a:
            for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x26); local_5a = local_5a + 1) {
              for (local_5c = 0;
                  local_5c < *(ushort *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 2);
                  local_5c = local_5c + 1) {
                uVar3 = read_u8(&local_68);
                *(uint8_t *)
                 (*(long *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) +
                 (ulong)local_5c * 0x14) = uVar3;
                fVar9 = read_f32(&local_68,local_4b);
                *(float *)(*(long *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) +
                           (ulong)local_5c * 0x14 + 4) = fVar9;
                fVar9 = read_f32(&local_68,local_4b);
                *(float *)(*(long *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) +
                           (ulong)local_5c * 0x14 + 8) = fVar9;
                fVar9 = read_f32(&local_68,local_4b);
                *(float *)(*(long *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) +
                           (ulong)local_5c * 0x14 + 0xc) = fVar9;
                uVar5 = read_u16(&local_68,local_4b);
                *(uint16_t *)
                 (*(long *)(*(long *)(local_10 + 0x68) + (ulong)local_5a * 0x10 + 8) +
                  (ulong)local_5c * 0x14 + 0x10) = uVar5;
              }
            }
          }
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_24) goto LAB_0011d16a;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_5,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8c3);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d16a:
          local_68 = local_68 + (int)((uint)local_46 << 1);
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_28) goto LAB_0011d1df;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_6,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8c7);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d1df:
          local_68 = local_68 + (int)((uint)*(ushort *)(local_10 + 0x20) * 6);
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_34) goto LAB_0011d259;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_7,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8cb);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d259:
          uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x20) << 3);
          *(undefined8 *)(local_10 + 0x30) = uVar8;
          for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x20); local_5a = local_5a + 1) {
            local_58 = SDL_strlen(local_68);
            local_58 = local_58 + 1;
            uVar8 = (**(code **)(local_10 + 200))(local_58);
            *(undefined8 *)(*(long *)(local_10 + 0x30) + (ulong)local_5a * 8) = uVar8;
            SDL_memcpy(*(undefined8 *)(*(long *)(local_10 + 0x30) + (ulong)local_5a * 8),local_68,
                       local_58);
            local_68 = local_68 + local_58;
          }
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_2c) goto LAB_0011d38e;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_8,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8d9);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d38e:
          local_68 = local_68 + (int)((uint)local_48 << 1);
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_30) goto LAB_0011d400;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_9,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8dd);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d400:
          local_68 = local_68 + (int)((uint)*(ushort *)(local_10 + 0x22) * 6);
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)local_38) goto LAB_0011d47a;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_10,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8e1);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d47a:
          uVar8 = (**(code **)(local_10 + 200))((ulong)*(ushort *)(local_10 + 0x22) << 3);
          *(undefined8 *)(local_10 + 0x38) = uVar8;
          for (local_5a = 0; local_5a < *(ushort *)(local_10 + 0x22); local_5a = local_5a + 1) {
            local_58 = SDL_strlen(local_68);
            local_58 = local_58 + 1;
            uVar8 = (**(code **)(local_10 + 200))(local_58);
            *(undefined8 *)(*(long *)(local_10 + 0x38) + (ulong)local_5a * 8) = uVar8;
            SDL_memcpy(*(undefined8 *)(*(long *)(local_10 + 0x38) + (ulong)local_5a * 8),local_68,
                       local_58);
            local_68 = local_68 + local_58;
          }
          if ((*(uint *)(local_18 + 0x14) & 1) != 0) {
            *(undefined8 *)(local_10 + 0x108) = *(undefined8 *)(local_18 + 8);
          }
          do {
            if ((long)local_68 - (long)puVar1 == (ulong)*(uint *)(local_18 + 0x10))
            goto LAB_0011d5e6;
            iVar6 = SDL_ReportAssertion(&FACT_INTERNAL_ParseAudioEngine::sdl_assert_data_11,
                                        "FACT_INTERNAL_ParseAudioEngine",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x8f5);
          } while (iVar6 == 0);
          if (iVar6 == 1) {
            pcVar2 = (code *)swi(3);
            uVar7 = (*pcVar2)();
            return uVar7;
          }
LAB_0011d5e6:
          local_4 = 0;
        }
        else {
          local_4 = 0xfffffffc;
        }
      }
      else {
        local_4 = 0xfffffffd;
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

uint32_t FACT_INTERNAL_ParseAudioEngine(
	FACTAudioEngine *pEngine,
	const FACTRuntimeParameters *pParams
) {
	uint32_t	categoryOffset,
			variableOffset,
			blob1Offset,
			categoryNameIndexOffset,
			blob2Offset,
			variableNameIndexOffset,
			categoryNameOffset,
			variableNameOffset,
			rpcOffset,
			dspPresetOffset,
			dspParameterOffset;
	uint16_t blob1Count, blob2Count;
	uint8_t version, tool;
	uint8_t se;
	uint32_t magic;
	size_t memsize;
	uint16_t i, j;

	uint8_t *ptr = (uint8_t*) pParams->pGlobalSettingsBuffer;
	uint8_t *start = ptr;

	magic = read_u32(&ptr, 0);
	se = magic == 0x58475346; /* Swap Endian */
	if (magic != 0x46534758 && magic != 0x58475346) /* 'XGSF' */
	{
		return -1; /* TODO: NOT XACT FILE */
	}

	if (!FACT_INTERNAL_SupportedContent(read_u16(&ptr, se)))
	{
		return -2;
	}

	tool = read_u16(&ptr, se); /* Tool version */
	if (tool != 42)
	{
		return -3;
	}

	ptr += 2; /* Unknown value */

	/* Last modified, unused */
	ptr += 8;

	/* XACT Version (Windows == 3, Xbox == 7) */
	version = read_u8(&ptr);
	if (	version != 3 &&
		version != 7	)
	{
		return -4; /* TODO: VERSION TOO OLD */
	}

	/* Object counts */
	pEngine->categoryCount = read_u16(&ptr, se);
	pEngine->variableCount = read_u16(&ptr, se);
	blob1Count = read_u16(&ptr, se);
	blob2Count = read_u16(&ptr, se);
	pEngine->rpcCount = read_u16(&ptr, se);
	pEngine->dspPresetCount = read_u16(&ptr, se);
	pEngine->dspParameterCount = read_u16(&ptr, se);

	/* Object offsets */
	categoryOffset = read_u32(&ptr, se);
	variableOffset = read_u32(&ptr, se);
	blob1Offset = read_u32(&ptr, se);
	categoryNameIndexOffset = read_u32(&ptr, se);
	blob2Offset = read_u32(&ptr, se);
	variableNameIndexOffset = read_u32(&ptr, se);
	categoryNameOffset = read_u32(&ptr, se);
	variableNameOffset = read_u32(&ptr, se);
	rpcOffset = read_u32(&ptr, se);
	dspPresetOffset = read_u32(&ptr, se);
	dspParameterOffset = read_u32(&ptr, se);

	/* Category data */
	FAudio_assert((ptr - start) == categoryOffset);
	pEngine->categories = (FACTAudioCategory*) pEngine->pMalloc(
		sizeof(FACTAudioCategory) * pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		pEngine->categories[i].instanceLimit = read_u8(&ptr);
		pEngine->categories[i].fadeInMS = read_u16(&ptr, se);
		pEngine->categories[i].fadeOutMS = read_u16(&ptr, se);
		pEngine->categories[i].maxInstanceBehavior = read_u8(&ptr) >> 3;
		pEngine->categories[i].parentCategory = read_u16(&ptr, se);
		pEngine->categories[i].volume = FACT_INTERNAL_CalculateAmplitudeRatio(
			read_volbyte(&ptr)
		);
		pEngine->categories[i].visibility = read_u8(&ptr);
		pEngine->categories[i].instanceCount = 0;
		pEngine->categories[i].currentVolume = 1.0f;
	}

	/* Variable data */
	FAudio_assert((ptr - start) == variableOffset);
	pEngine->variables = (FACTVariable*) pEngine->pMalloc(
		sizeof(FACTVariable) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->variables[i].accessibility = read_u8(&ptr);
		pEngine->variables[i].initialValue = read_f32(&ptr, se);
		pEngine->variables[i].minValue = read_f32(&ptr, se);
		pEngine->variables[i].maxValue = read_f32(&ptr, se);
	}

	/* Global variable storage. Some unused data for non-global vars */
	pEngine->globalVariableValues = (float*) pEngine->pMalloc(
		sizeof(float) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->globalVariableValues[i] = pEngine->variables[i].initialValue;
	}

	/* RPC data */
	if (pEngine->rpcCount > 0)
	{
		FAudio_assert((ptr - start) == rpcOffset);
		pEngine->rpcs = (FACTRPC*) pEngine->pMalloc(
			sizeof(FACTRPC) *
			pEngine->rpcCount
		);
		pEngine->rpcCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->rpcCount
		);
		for (i = 0; i < pEngine->rpcCount; i += 1)
		{
			pEngine->rpcCodes[i] = (uint32_t) (ptr - start);
			pEngine->rpcs[i].variable = read_u16(&ptr, se);
			pEngine->rpcs[i].pointCount = read_u8(&ptr);
			pEngine->rpcs[i].parameter = read_u16(&ptr, se);
			pEngine->rpcs[i].points = (FACTRPCPoint*) pEngine->pMalloc(
				sizeof(FACTRPCPoint) *
				pEngine->rpcs[i].pointCount
			);
			for (j = 0; j < pEngine->rpcs[i].pointCount; j += 1)
			{
				pEngine->rpcs[i].points[j].x = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].y = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].type = read_u8(&ptr);
			}
		}
	}

	/* DSP Preset data */
	if (pEngine->dspPresetCount > 0)
	{
		FAudio_assert((ptr - start) == dspPresetOffset);
		pEngine->dspPresets = (FACTDSPPreset*) pEngine->pMalloc(
			sizeof(FACTDSPPreset) *
			pEngine->dspPresetCount
		);
		pEngine->dspPresetCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->dspPresetCount
		);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			pEngine->dspPresetCodes[i] = (uint32_t) (ptr - start);
			pEngine->dspPresets[i].accessibility = read_u8(&ptr);
			pEngine->dspPresets[i].parameterCount = read_u16(&ptr, se);
			ptr += 2; /* Unknown value */
			pEngine->dspPresets[i].parameters = (FACTDSPParameter*) pEngine->pMalloc(
				sizeof(FACTDSPParameter) *
				pEngine->dspPresets[i].parameterCount
			); /* This will be filled in just a moment... */
		}

		/* DSP Parameter data */
		FAudio_assert((ptr - start) == dspParameterOffset);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			for (j = 0; j < pEngine->dspPresets[i].parameterCount; j += 1)
			{
				pEngine->dspPresets[i].parameters[j].type = read_u8(&ptr);
				pEngine->dspPresets[i].parameters[j].value = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].minVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].maxVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].unknown = read_u16(&ptr, se);
			}
		}
	}

	/* Blob #1, no idea what this is... */
	FAudio_assert((ptr - start) == blob1Offset);
	ptr += blob1Count * 2;

	/* Category Name Index data */
	FAudio_assert((ptr - start) == categoryNameIndexOffset);
	ptr += pEngine->categoryCount * 6; /* FIXME: index as assert value? */

	/* Category Name data */
	FAudio_assert((ptr - start) == categoryNameOffset);
	pEngine->categoryNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->categoryNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->categoryNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Blob #2, no idea what this is... */
	FAudio_assert((ptr - start) == blob2Offset);
	ptr += blob2Count * 2;

	/* Variable Name Index data */
	FAudio_assert((ptr - start) == variableNameIndexOffset);
	ptr += pEngine->variableCount * 6; /* FIXME: index as assert value? */

	/* Variable Name data */
	FAudio_assert((ptr - start) == variableNameOffset);
	pEngine->variableNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->variableNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->variableNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Store this pointer in case we're asked to free it */
	if (pParams->globalSettingsFlags & FACT_FLAG_MANAGEDATA)
	{
		pEngine->settings = pParams->pGlobalSettingsBuffer;
	}

	/* Finally. */
	FAudio_assert((ptr - start) == pParams->globalSettingsBufferSize);
	return 0;
}